

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

uint __thiscall CaDiCaL::heap<CaDiCaL::elim_more>::pop_front(heap<CaDiCaL::elim_more> *this)

{
  uint a;
  uint b;
  uint *puVar1;
  char *pcVar2;
  pointer puVar3;
  int in_EDX;
  int extraout_EDX;
  
  puVar1 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  a = *puVar1;
  b = puVar3[-1];
  if (4 < (ulong)((long)puVar3 - (long)puVar1)) {
    exchange(this,a,b);
    in_EDX = extraout_EDX;
  }
  pcVar2 = index(this,(char *)(ulong)a,in_EDX);
  pcVar2[0] = -1;
  pcVar2[1] = -1;
  pcVar2[2] = -1;
  pcVar2[3] = -1;
  puVar3 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  if (4 < (ulong)((long)puVar3 -
                 (long)(this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    down(this,b);
  }
  return a;
}

Assistant:

unsigned pop_front () {
    assert (!empty ());
    unsigned res = array[0], last = array.back ();
    if (size () > 1)
      exchange (res, last);
    index (res) = invalid_heap_position;
    array.pop_back ();
    if (size () > 1)
      down (last);
    check ();
    return res;
  }